

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

MAP_HANDLE Map_Clone(MAP_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  char **ppcVar2;
  LOGGER_LOG l_3;
  size_t i;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  MAP_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  MAP_HANDLE_DATA *result;
  MAP_HANDLE handle_local;
  
  if (handle == (MAP_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/map.c"
                ,"Map_Clone",0x6c,1,"invalid arg to Map_Clone (NULL)");
    }
  }
  else {
    l = (LOGGER_LOG)calloc(1,0x20);
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/map.c"
                  ,"Map_Clone",0x76,1,"unable to malloc");
      }
    }
    else if (handle->count == 0) {
      *(long *)(l + 0x10) = 0;
      *(long *)l = 0;
      *(long *)(l + 8) = 0;
      *(long *)(l + 0x18) = 0;
    }
    else {
      *(MAP_FILTER_CALLBACK *)(l + 0x18) = handle->mapFilterCallback;
      *(size_t *)(l + 0x10) = handle->count;
      ppcVar2 = Map_CloneVector(handle->keys,handle->count);
      *(char ***)l = ppcVar2;
      if (ppcVar2 == (char **)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/map.c"
                    ,"Map_Clone",0x88,1,"unable to clone keys");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        ppcVar2 = Map_CloneVector(handle->values,handle->count);
        *(char ***)(l + 8) = ppcVar2;
        if (ppcVar2 == (char **)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/map.c"
                      ,"Map_Clone",0x90,1,"unable to clone values");
          }
          for (l_3 = (LOGGER_LOG)0x0; l_3 < *(LOGGER_LOG *)(l + 0x10); l_3 = l_3 + 1) {
            free(*(void **)(*(long *)l + (long)l_3 * 8));
          }
          free(*(void **)l);
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (MAP_HANDLE)l;
}

Assistant:

MAP_HANDLE Map_Clone(MAP_HANDLE handle)
{
    MAP_HANDLE_DATA* result;
    if (handle == NULL)
    {
        /*Codes_SRS_MAP_02_038: [Map_Clone returns NULL if parameter handle is NULL.]*/
        result = NULL;
        LogError("invalid arg to Map_Clone (NULL)");
    }
    else
    {
        MAP_HANDLE_DATA * handleData = (MAP_HANDLE_DATA *)handle;
        result = (MAP_HANDLE_DATA*)calloc(1, sizeof(MAP_HANDLE_DATA));
        if (result == NULL)
        {
            /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
            /*do nothing, proceed to return it, this is an error case*/
            LogError("unable to malloc");
        }
        else
        {
            if (handleData->count == 0)
            {
                result->count = 0;
                result->keys = NULL;
                result->values = NULL;
                result->mapFilterCallback = NULL;
            }
            else
            {
                result->mapFilterCallback = handleData->mapFilterCallback;
                result->count = handleData->count;
                if( (result->keys = Map_CloneVector((const char* const*)handleData->keys, handleData->count))==NULL)
                {
                    /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
                    LogError("unable to clone keys");
                    free(result);
                    result = NULL;
                }
                else if ((result->values = Map_CloneVector((const char* const*)handleData->values, handleData->count)) == NULL)
                {
                    size_t i;
                    /*Codes_SRS_MAP_02_047: [If during cloning, any operation fails, then Map_Clone shall return NULL.] */
                    LogError("unable to clone values");
                    for (i = 0; i < result->count; i++)
                    {
                        free(result->keys[i]);
                    }
                    free(result->keys);
                    free(result);
                    result = NULL;
                }
                else
                {
                    /*all fine, return it*/
                }
            }
        }
    }
    return (MAP_HANDLE)result;
}